

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

void * __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_struct
          (Impl *this,VkMutableDescriptorTypeCreateInfoEXT *create_info,ScratchAllocator *alloc)

{
  VkMutableDescriptorTypeCreateInfoEXT *pVVar1;
  VkMutableDescriptorTypeListEXT *pVVar2;
  VkDescriptorType *pVVar3;
  VkMutableDescriptorTypeListEXT *l;
  uint32_t i;
  VkMutableDescriptorTypeCreateInfoEXT *info;
  ScratchAllocator *alloc_local;
  VkMutableDescriptorTypeCreateInfoEXT *create_info_local;
  Impl *this_local;
  
  pVVar1 = copy<VkMutableDescriptorTypeCreateInfoEXT>(this,create_info,1,alloc);
  if (pVVar1->pMutableDescriptorTypeLists != (VkMutableDescriptorTypeListEXT *)0x0) {
    pVVar2 = copy<VkMutableDescriptorTypeListEXT>
                       (this,create_info->pMutableDescriptorTypeLists,
                        (ulong)create_info->mutableDescriptorTypeListCount,alloc);
    pVVar1->pMutableDescriptorTypeLists = pVVar2;
  }
  for (l._4_4_ = 0; l._4_4_ < pVVar1->mutableDescriptorTypeListCount; l._4_4_ = l._4_4_ + 1) {
    pVVar2 = pVVar1->pMutableDescriptorTypeLists + l._4_4_;
    if (pVVar2->pDescriptorTypes != (VkDescriptorType *)0x0) {
      pVVar3 = copy<VkDescriptorType>
                         (this,pVVar2->pDescriptorTypes,(ulong)pVVar2->descriptorTypeCount,alloc);
      pVVar2->pDescriptorTypes = pVVar3;
    }
  }
  return pVVar1;
}

Assistant:

void *StateRecorder::Impl::copy_pnext_struct(const VkMutableDescriptorTypeCreateInfoEXT *create_info,
                                             ScratchAllocator &alloc)
{
	auto *info = copy(create_info, 1, alloc);
	if (info->pMutableDescriptorTypeLists)
		info->pMutableDescriptorTypeLists = copy(create_info->pMutableDescriptorTypeLists, create_info->mutableDescriptorTypeListCount, alloc);

	for (uint32_t i = 0; i < info->mutableDescriptorTypeListCount; i++)
	{
		auto &l = const_cast<VkMutableDescriptorTypeListEXT &>(info->pMutableDescriptorTypeLists[i]);
		if (l.pDescriptorTypes)
			l.pDescriptorTypes = copy(l.pDescriptorTypes, l.descriptorTypeCount, alloc);
	}

	return info;
}